

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_matrix.c
# Opt level: O0

REF_STATUS ref_matrix_mult_gen(REF_INT n,REF_DBL *a,REF_DBL *b,REF_DBL *r)

{
  int iVar1;
  int local_34;
  int local_30;
  REF_INT k;
  REF_INT j;
  REF_INT i;
  REF_DBL *r_local;
  REF_DBL *b_local;
  REF_DBL *a_local;
  REF_INT n_local;
  
  for (local_30 = 0; local_30 < n; local_30 = local_30 + 1) {
    for (k = 0; k < n; k = k + 1) {
      r[k + local_30 * n] = 0.0;
      for (local_34 = 0; local_34 < n; local_34 = local_34 + 1) {
        iVar1 = k + local_30 * n;
        r[iVar1] = a[k + local_34 * n] * b[local_34 + local_30 * n] + r[iVar1];
      }
    }
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_matrix_mult_gen(REF_INT n, REF_DBL *a, REF_DBL *b,
                                       REF_DBL *r) {
  REF_INT i, j, k;

  for (j = 0; j < n; j++)
    for (i = 0; i < n; i++) {
      r[i + j * n] = 0.0;
      for (k = 0; k < n; k++) r[i + j * n] += a[i + k * n] * b[k + j * n];
    }
  return REF_SUCCESS;
}